

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int add_a_mem(em8051 *aCPU)

{
  int value2;
  int value;
  em8051 *aCPU_local;
  
  value2 = read_mem(aCPU,(uint)aCPU->mCodeMem[(int)(aCPU->mPC + 1U & aCPU->mCodeMemSize - 1U)]);
  add_solve_flags(aCPU,(uint)aCPU->mSFR[0x60],value2,0);
  aCPU->mSFR[0x60] = aCPU->mSFR[0x60] + (char)value2;
  aCPU->mPC = aCPU->mPC + 2;
  return 0;
}

Assistant:

static int add_a_mem(struct em8051 *aCPU)
{
    int value = read_mem(aCPU, OPERAND1);
    add_solve_flags(aCPU, ACC, value, 0);
    ACC += value;
	PC += 2;
    return 0;
}